

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O1

void __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushOperand
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,uint codepoint)

{
  SizeType SVar1;
  State *pSVar2;
  Frag *pFVar3;
  
  pSVar2 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                     (&this->states_,1);
  pSVar2->out = 0xffffffff;
  pSVar2->out1 = 0xffffffff;
  pSVar2->codepoint = codepoint;
  pSVar2->rangeStart = 0xffffffff;
  SVar1 = this->stateCount_;
  this->stateCount_ = SVar1 + 1;
  pFVar3 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     (operandStack,1);
  pFVar3->start = SVar1;
  pFVar3->out = SVar1;
  pFVar3->minIndex = SVar1;
  return;
}

Assistant:

void PushOperand(Stack<Allocator>& operandStack, unsigned codepoint) {
        SizeType s = NewState(kRegexInvalidState, kRegexInvalidState, codepoint);
        *operandStack.template Push<Frag>() = Frag(s, s, s);
    }